

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Miscellaneous.cpp
# Opt level: O2

void __thiscall chatra::Lock::releaseIfExists(Lock *this,Reference ref,LockType lockType)

{
  int iVar1;
  ReferenceGroup *pRVar2;
  size_type sVar3;
  ReferenceNode *local_10;
  Reference ref_local;
  
  local_10 = ref.node;
  sVar3 = std::
          _Hashtable<chatra::Reference,_chatra::Reference,_std::allocator<chatra::Reference>,_std::__detail::_Identity,_std::equal_to<chatra::Reference>,_std::hash<chatra::Reference>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::_M_erase(&this->refs[(int)lockType]._M_h,&local_10);
  if (sVar3 != 0) {
    pRVar2 = local_10->group;
    iVar1 = (pRVar2->super_Lockable).lockCount;
    (pRVar2->super_Lockable).lockCount = iVar1 + -1;
    if (iVar1 < 2) {
      LOCK();
      (pRVar2->super_Lockable).lockRequester._M_i = 0xffffffffffffffff;
      UNLOCK();
    }
  }
  return;
}

Assistant:

void Lock::releaseIfExists(Reference ref, LockType lockType) {
	chatra_assert(!methodCall);
	CHATRA_DEBUG_LOCK_AUDIT;
	if (refs[static_cast<size_t>(lockType)].erase(ref) != 0) {
		CHATRA_DEBUG_LOCK_LOG1("releaseIfExists_exists", ref, lockType);
		ref.unlock();
	}
	else
		CHATRA_DEBUG_LOCK_LOG1("releaseIfExists_does_not_exist", ref, lockType);
}